

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map.hpp
# Opt level: O2

pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
 __thiscall
ska::detailv3::
sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
::emplace<std::basic_string_view<char,std::char_traits<char>>&>
          (sherwood_v3_table<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<unsigned_long,slang::Hasher<std::basic_string_view<char,std::char_traits<char>>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,ska::detailv3::functor_storage<bool,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,std::char_traits<char>>>>>
           *this,basic_string_view<char,_std::char_traits<char>_> *key)

{
  bool bVar1;
  size_t sVar2;
  char distance_from_desired;
  EntryPointer current_entry;
  pair<ska::detailv3::sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>::templated_iterator<std::basic_string_view<char,_std::char_traits<char>_>_>,_bool>
  pVar3;
  
  sVar2 = slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                    ((Hasher<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,key);
  current_entry =
       (EntryPointer)
       ((sVar2 * -0x61c8864680b583eb >> ((byte)this[0x10] & 0x3f)) * 0x18 + *(long *)this);
  distance_from_desired = '\0';
  while( true ) {
    if (current_entry->distance_from_desired < distance_from_desired) {
      pVar3 = emplace_new_key<std::basic_string_view<char,std::char_traits<char>>&>
                        (this,distance_from_desired,current_entry,key);
      return pVar3;
    }
    bVar1 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                      ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)this,key,
                       &(current_entry->field_1).value);
    if (bVar1) break;
    current_entry = current_entry + 1;
    distance_from_desired = distance_from_desired + '\x01';
  }
  pVar3._8_8_ = 0;
  pVar3.first.current = current_entry;
  return pVar3;
}

Assistant:

std::pair<iterator, bool> emplace(Key && key, Args &&... args)
    {
        size_t index = hash_policy.index_for_hash(hash_object(key), num_slots_minus_one);
        EntryPointer current_entry = entries + ptrdiff_t(index);
        int8_t distance_from_desired = 0;
        for (; current_entry->distance_from_desired >= distance_from_desired; ++current_entry, ++distance_from_desired)
        {
            if (compares_equal(key, current_entry->value))
                return { { current_entry }, false };
        }
        return emplace_new_key(distance_from_desired, current_entry, std::forward<Key>(key), std::forward<Args>(args)...);
    }